

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::Recover(DBImpl *this,VersionEdit *edit,bool *save_manifest)

{
  Env *pEVar1;
  bool bVar2;
  int iVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  size_type sVar6;
  size_type sVar7;
  DBImpl *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  size_t i_1;
  size_t i;
  uint64_t prev_log;
  uint64_t min_log;
  vector<unsigned_long,_std::allocator<unsigned_long>_> logs;
  FileType type;
  uint64_t number;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  SequenceNumber max_sequence;
  Status s;
  char buf [50];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> expected;
  VersionSet *in_stack_fffffffffffffcc8;
  string *in_stack_fffffffffffffcd0;
  VersionSet *in_stack_fffffffffffffcd8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffce0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffce8;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffd00;
  VersionSet *in_stack_fffffffffffffd08;
  DBImpl *in_stack_fffffffffffffd40;
  VersionEdit *edit_00;
  bool *save_manifest_00;
  char *log_number;
  VersionSet *in_stack_fffffffffffffde8;
  ulong uVar8;
  ulong uVar9;
  ulong local_200;
  int local_16c;
  ulong local_168;
  undefined1 local_160 [8];
  undefined1 local_158 [24];
  undefined1 local_140 [144];
  Version *in_stack_ffffffffffffff50;
  pointer local_8;
  
  local_8 = *(pointer *)(in_FS_OFFSET + 0x28);
  log_number = in_RDI;
  port::Mutex::AssertHeld((Mutex *)in_stack_fffffffffffffcc8);
  (*in_RSI->env_->_vptr_Env[9])(local_140 + 0x60,in_RSI->env_,&in_RSI->dbname_);
  Status::~Status((Status *)in_stack_fffffffffffffcc8);
  if (in_RSI->db_lock_ != (FileLock *)0x0) {
    __assert_fail("db_lock_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x129,"Status leveldb::DBImpl::Recover(VersionEdit *, bool *)");
  }
  edit_00 = (VersionEdit *)in_RSI->env_;
  save_manifest_00 = (bool *)&stack0xffffffffffffffd8;
  LockFileName(in_stack_fffffffffffffcd0);
  (**(code **)((edit_00->comparator_)._M_dataplus._M_p + 0x68))
            (local_140 + 0x58,edit_00,save_manifest_00,&in_RSI->db_lock_);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcc8);
  bVar2 = Status::ok((Status *)in_stack_fffffffffffffcc8);
  if (!bVar2) {
    Status::Status((Status *)in_stack_fffffffffffffcc8,(Status *)0xd0e563);
    goto LAB_00d0eebf;
  }
  pEVar1 = in_RSI->env_;
  CurrentFileName(in_stack_fffffffffffffcd0);
  iVar3 = (*pEVar1->_vptr_Env[6])(pEVar1,&stack0xffffffffffffffb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcc8);
  if ((((byte)iVar3 ^ 0xff) & 1) == 0) {
    if (((in_RSI->options_).error_if_exists & 1U) != 0) {
      Slice::Slice((Slice *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      Slice::Slice((Slice *)in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
      Status::InvalidArgument((Slice *)in_stack_fffffffffffffcd0,(Slice *)in_stack_fffffffffffffcc8)
      ;
      goto LAB_00d0eebf;
    }
  }
  else {
    if (((in_RSI->options_).create_if_missing & 1U) == 0) {
      Slice::Slice((Slice *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      Slice::Slice((Slice *)in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
      Status::InvalidArgument((Slice *)in_stack_fffffffffffffcd0,(Slice *)in_stack_fffffffffffffcc8)
      ;
      goto LAB_00d0eebf;
    }
    NewDB(in_stack_fffffffffffffd40);
    Status::operator=((Status *)in_stack_fffffffffffffcd8,(Status *)in_stack_fffffffffffffcd0);
    Status::~Status((Status *)in_stack_fffffffffffffcc8);
    bVar2 = Status::ok((Status *)in_stack_fffffffffffffcc8);
    if (!bVar2) {
      Status::Status((Status *)in_stack_fffffffffffffcc8,(Status *)0xd0e6c6);
      goto LAB_00d0eebf;
    }
  }
  VersionSet::Recover(in_stack_fffffffffffffde8,(bool *)in_RSI);
  Status::operator=((Status *)in_stack_fffffffffffffcd8,(Status *)in_stack_fffffffffffffcd0);
  Status::~Status((Status *)in_stack_fffffffffffffcc8);
  bVar2 = Status::ok((Status *)in_stack_fffffffffffffcc8);
  if (bVar2) {
    local_140._0_8_ = (VersionSet *)0x0;
    uVar4 = VersionSet::LogNumber(in_stack_fffffffffffffcc8);
    uVar5 = VersionSet::PrevLogNumber(in_stack_fffffffffffffcc8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffcc8);
    (*in_RSI->env_->_vptr_Env[7])(local_160,in_RSI->env_,&in_RSI->dbname_,local_158);
    Status::operator=((Status *)in_stack_fffffffffffffcd8,(Status *)in_stack_fffffffffffffcd0);
    Status::~Status((Status *)in_stack_fffffffffffffcc8);
    bVar2 = Status::ok((Status *)in_stack_fffffffffffffcc8);
    if (bVar2) {
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffcc8);
      VersionSet::AddLiveFiles(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffcc8)
      ;
      local_200 = 0;
      while (uVar8 = local_200,
            sVar6 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffcc8), uVar8 < sVar6) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffcd8,(size_type)in_stack_fffffffffffffcd0);
        bVar2 = ParseFileName((string *)in_stack_fffffffffffffce0._M_current,
                              (uint64_t *)in_stack_fffffffffffffcd8,
                              (FileType *)in_stack_fffffffffffffcd0);
        if (((bVar2) &&
            (std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             erase((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffcd8,(key_type *)in_stack_fffffffffffffcd0), local_16c == 0)
            ) && ((uVar4 <= local_168 || (local_168 == uVar5)))) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffcd8,(value_type_conflict5 *)in_stack_fffffffffffffcd0);
        }
        local_200 = local_200 + 1;
      }
      bVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
              empty((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffffcc8);
      if (bVar2) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffcd0);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffcd0);
        std::
        sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
        uVar8 = 0;
        while (uVar9 = uVar8,
              sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_fffffffffffffcc8), uVar8 < sVar6) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffcd8,(size_type)in_stack_fffffffffffffcd0);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffcc8);
          in_stack_fffffffffffffcc8 = (VersionSet *)local_140;
          RecoverLogFile(in_RSI,(uint64_t)log_number,SUB81((ulong)in_RDI >> 0x38,0),save_manifest_00
                         ,edit_00,(SequenceNumber *)in_stack_ffffffffffffff50);
          Status::operator=((Status *)in_stack_fffffffffffffcd8,(Status *)in_stack_fffffffffffffcd0)
          ;
          Status::~Status((Status *)in_stack_fffffffffffffcc8);
          bVar2 = Status::ok((Status *)in_stack_fffffffffffffcc8);
          if (!bVar2) {
            Status::Status((Status *)in_stack_fffffffffffffcc8,(Status *)0xd0eda2);
            goto LAB_00d0ee69;
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffcd8,(size_type)in_stack_fffffffffffffcd0);
          VersionSet::MarkFileNumberUsed
                    (in_stack_fffffffffffffcd8,(uint64_t)in_stack_fffffffffffffcd0);
          uVar8 = uVar9 + 1;
        }
        in_stack_fffffffffffffcd8 =
             (VersionSet *)VersionSet::LastSequence(in_stack_fffffffffffffcc8);
        if (in_stack_fffffffffffffcd8 < (ulong)local_140._0_8_) {
          VersionSet::SetLastSequence(in_stack_fffffffffffffcd8,(uint64_t)in_stack_fffffffffffffcd0)
          ;
        }
        Status::OK();
      }
      else {
        sVar7 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )in_stack_fffffffffffffcc8);
        snprintf(local_140 + 0x88,0x32,"%d missing files; e.g.",sVar7 & 0xffffffff);
        Slice::Slice((Slice *)in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffcd0);
        std::_Rb_tree_const_iterator<unsigned_long>::operator*
                  ((_Rb_tree_const_iterator<unsigned_long> *)in_stack_fffffffffffffcc8);
        TableFileName((string *)in_stack_fffffffffffffce0._M_current,
                      (uint64_t)in_stack_fffffffffffffcd8);
        Slice::Slice((Slice *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
        Status::Corruption((Slice *)in_stack_fffffffffffffcd0,(Slice *)in_stack_fffffffffffffcc8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcc8);
      }
LAB_00d0ee69:
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffcd8)
      ;
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffcc8);
    }
    else {
      Status::Status((Status *)in_stack_fffffffffffffcc8,(Status *)0xd0e98f);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffcd8);
  }
  else {
    Status::Status((Status *)in_stack_fffffffffffffcc8,(Status *)0xd0e86a);
  }
LAB_00d0eebf:
  Status::~Status((Status *)in_stack_fffffffffffffcc8);
  if (*(pointer *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (Status)log_number;
}

Assistant:

Status DBImpl::Recover(VersionEdit* edit, bool* save_manifest) {
  mutex_.AssertHeld();

  // Ignore error from CreateDir since the creation of the DB is
  // committed only when the descriptor is created, and this directory
  // may already exist from a previous failed creation attempt.
  env_->CreateDir(dbname_);
  assert(db_lock_ == nullptr);
  Status s = env_->LockFile(LockFileName(dbname_), &db_lock_);
  if (!s.ok()) {
    return s;
  }

  if (!env_->FileExists(CurrentFileName(dbname_))) {
    if (options_.create_if_missing) {
      s = NewDB();
      if (!s.ok()) {
        return s;
      }
    } else {
      return Status::InvalidArgument(
          dbname_, "does not exist (create_if_missing is false)");
    }
  } else {
    if (options_.error_if_exists) {
      return Status::InvalidArgument(dbname_,
                                     "exists (error_if_exists is true)");
    }
  }

  s = versions_->Recover(save_manifest);
  if (!s.ok()) {
    return s;
  }
  SequenceNumber max_sequence(0);

  // Recover from all newer log files than the ones named in the
  // descriptor (new log files may have been added by the previous
  // incarnation without registering them in the descriptor).
  //
  // Note that PrevLogNumber() is no longer used, but we pay
  // attention to it in case we are recovering a database
  // produced by an older version of leveldb.
  const uint64_t min_log = versions_->LogNumber();
  const uint64_t prev_log = versions_->PrevLogNumber();
  std::vector<std::string> filenames;
  s = env_->GetChildren(dbname_, &filenames);
  if (!s.ok()) {
    return s;
  }
  std::set<uint64_t> expected;
  versions_->AddLiveFiles(&expected);
  uint64_t number;
  FileType type;
  std::vector<uint64_t> logs;
  for (size_t i = 0; i < filenames.size(); i++) {
    if (ParseFileName(filenames[i], &number, &type)) {
      expected.erase(number);
      if (type == kLogFile && ((number >= min_log) || (number == prev_log)))
        logs.push_back(number);
    }
  }
  if (!expected.empty()) {
    char buf[50];
    snprintf(buf, sizeof(buf), "%d missing files; e.g.",
             static_cast<int>(expected.size()));
    return Status::Corruption(buf, TableFileName(dbname_, *(expected.begin())));
  }

  // Recover in the order in which the logs were generated
  std::sort(logs.begin(), logs.end());
  for (size_t i = 0; i < logs.size(); i++) {
    s = RecoverLogFile(logs[i], (i == logs.size() - 1), save_manifest, edit,
                       &max_sequence);
    if (!s.ok()) {
      return s;
    }

    // The previous incarnation may not have written any MANIFEST
    // records after allocating this log number.  So we manually
    // update the file number allocation counter in VersionSet.
    versions_->MarkFileNumberUsed(logs[i]);
  }

  if (versions_->LastSequence() < max_sequence) {
    versions_->SetLastSequence(max_sequence);
  }

  return Status::OK();
}